

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlTextReaderPtr xmlNewTextReader(xmlParserInputBufferPtr input,char *URI)

{
  xmlSAXHandlerPtr sax;
  xmlBufPtr pxVar1;
  size_t sVar2;
  xmlChar *chunk;
  xmlParserCtxtPtr pxVar3;
  xmlTextReaderPtr ret;
  char *URI_local;
  xmlParserInputBufferPtr input_local;
  
  if (input == (xmlParserInputBufferPtr)0x0) {
    input_local = (xmlParserInputBufferPtr)0x0;
  }
  else {
    input_local = (xmlParserInputBufferPtr)(*xmlMalloc)(0x160);
    if (input_local == (xmlParserInputBufferPtr)0x0) {
      input_local = (xmlParserInputBufferPtr)0x0;
    }
    else {
      memset(input_local,0,0x160);
      input_local->readcallback = (xmlInputReadCallback)0x0;
      input_local[2].rawconsumed = 0;
      input_local[2].error = 0;
      input_local[2].compressed = 0;
      *(xmlParserInputBufferPtr *)&input_local->compressed = input;
      pxVar1 = xmlBufCreate(0x32);
      input_local[2].encoder = (xmlCharEncodingHandlerPtr)pxVar1;
      if (input_local[2].encoder == (xmlCharEncodingHandlerPtr)0x0) {
        (*xmlFree)(input_local);
        input_local = (xmlParserInputBufferPtr)0x0;
      }
      else {
        pxVar1 = (xmlBufPtr)(*xmlMalloc)(0x100);
        input_local->raw = pxVar1;
        if (input_local->raw == (xmlBufPtr)0x0) {
          xmlBufFree((xmlBufPtr)input_local[2].encoder);
          (*xmlFree)(input_local);
          input_local = (xmlParserInputBufferPtr)0x0;
        }
        else {
          xmlSAXVersion((xmlSAXHandler *)input_local->raw,2);
          input_local->rawconsumed = (unsigned_long)input_local->raw[2].content;
          input_local->raw[2].content = (xmlChar *)xmlTextReaderStartElement;
          input_local[1].context = *(void **)&input_local->raw[2].compat_use;
          *(code **)&input_local->raw[2].compat_use = xmlTextReaderEndElement;
          if (input_local->raw[3].flags == 0xdeedbeaf) {
            input_local[1].readcallback = *(xmlInputReadCallback *)&input_local->raw[4].compat_use;
            *(code **)&input_local->raw[4].compat_use = xmlTextReaderStartElementNs;
            input_local[1].closecallback = (xmlInputCloseCallback)input_local->raw[4].mem;
            input_local->raw[4].mem = (xmlChar *)xmlTextReaderEndElementNs;
          }
          else {
            input_local[1].readcallback = (xmlInputReadCallback)0x0;
            input_local[1].closecallback = (xmlInputCloseCallback)0x0;
          }
          input_local[1].encoder = (xmlCharEncodingHandlerPtr)input_local->raw[2].use;
          input_local->raw[2].use = (size_t)xmlTextReaderCharacters;
          input_local->raw[2].size = (size_t)xmlTextReaderCharacters;
          input_local[1].buffer = (xmlBufPtr)input_local->raw[3].size;
          input_local->raw[3].size = (size_t)xmlTextReaderCDataBlock;
          *(undefined4 *)&input_local->context = 0;
          input_local[1].compressed = 0;
          input_local[1].error = 0;
          input_local[1].rawconsumed = 0;
          sVar2 = xmlBufUse(*(xmlBufPtr *)(*(long *)&input_local->compressed + 0x20));
          if (sVar2 < 4) {
            xmlParserInputBufferRead(input,4);
          }
          sVar2 = xmlBufUse(*(xmlBufPtr *)(*(long *)&input_local->compressed + 0x20));
          if (sVar2 < 4) {
            pxVar3 = xmlCreatePushParserCtxt
                               ((xmlSAXHandlerPtr)input_local->raw,(void *)0x0,(char *)0x0,0,URI);
            input_local->buffer = (xmlBufPtr)pxVar3;
            *(undefined4 *)&input_local[1].raw = 0;
            *(undefined4 *)((long)&input_local[1].raw + 4) = 0;
          }
          else {
            sax = (xmlSAXHandlerPtr)input_local->raw;
            chunk = xmlBufContent(*(xmlBuf **)(*(long *)&input_local->compressed + 0x20));
            pxVar3 = xmlCreatePushParserCtxt(sax,(void *)0x0,(char *)chunk,4,URI);
            input_local->buffer = (xmlBufPtr)pxVar3;
            *(undefined4 *)&input_local[1].raw = 0;
            *(undefined4 *)((long)&input_local[1].raw + 4) = 4;
          }
          if (input_local->buffer == (xmlBufPtr)0x0) {
            xmlBufFree((xmlBufPtr)input_local[2].encoder);
            (*xmlFree)(input_local->raw);
            (*xmlFree)(input_local);
            input_local = (xmlParserInputBufferPtr)0x0;
          }
          else {
            *(undefined4 *)&input_local->buffer[0xc].mem = 5;
            input_local->buffer[7].size = (size_t)input_local;
            *(undefined4 *)((long)&input_local->buffer[7].maxSize + 4) = 1;
            input_local->buffer[10].compat_use = 1;
            *(undefined4 *)((long)&input_local->closecallback + 4) = 2;
            input_local[2].buffer = *(xmlBufPtr *)&input_local->buffer[8].compat_use;
            *(undefined4 *)&input_local[4].closecallback = 0;
            input_local[4].compressed = 0;
            input_local[4].rawconsumed = 0;
          }
        }
      }
    }
  }
  return (xmlTextReaderPtr)input_local;
}

Assistant:

xmlTextReaderPtr
xmlNewTextReader(xmlParserInputBufferPtr input, const char *URI) {
    xmlTextReaderPtr ret;

    if (input == NULL)
	return(NULL);
    ret = xmlMalloc(sizeof(xmlTextReader));
    if (ret == NULL)
	return(NULL);
    memset(ret, 0, sizeof(xmlTextReader));
    ret->doc = NULL;
    ret->entTab = NULL;
    ret->entMax = 0;
    ret->entNr = 0;
    ret->input = input;
    ret->buffer = xmlBufCreate(50);
    if (ret->buffer == NULL) {
        xmlFree(ret);
	return(NULL);
    }
    ret->sax = (xmlSAXHandler *) xmlMalloc(sizeof(xmlSAXHandler));
    if (ret->sax == NULL) {
	xmlBufFree(ret->buffer);
	xmlFree(ret);
	return(NULL);
    }
    xmlSAXVersion(ret->sax, 2);
    ret->startElement = ret->sax->startElement;
    ret->sax->startElement = xmlTextReaderStartElement;
    ret->endElement = ret->sax->endElement;
    ret->sax->endElement = xmlTextReaderEndElement;
#ifdef LIBXML_SAX1_ENABLED
    if (ret->sax->initialized == XML_SAX2_MAGIC) {
#endif /* LIBXML_SAX1_ENABLED */
	ret->startElementNs = ret->sax->startElementNs;
	ret->sax->startElementNs = xmlTextReaderStartElementNs;
	ret->endElementNs = ret->sax->endElementNs;
	ret->sax->endElementNs = xmlTextReaderEndElementNs;
#ifdef LIBXML_SAX1_ENABLED
    } else {
	ret->startElementNs = NULL;
	ret->endElementNs = NULL;
    }
#endif /* LIBXML_SAX1_ENABLED */
    ret->characters = ret->sax->characters;
    ret->sax->characters = xmlTextReaderCharacters;
    ret->sax->ignorableWhitespace = xmlTextReaderCharacters;
    ret->cdataBlock = ret->sax->cdataBlock;
    ret->sax->cdataBlock = xmlTextReaderCDataBlock;

    ret->mode = XML_TEXTREADER_MODE_INITIAL;
    ret->node = NULL;
    ret->curnode = NULL;
    if (xmlBufUse(ret->input->buffer) < 4) {
	xmlParserInputBufferRead(input, 4);
    }
    if (xmlBufUse(ret->input->buffer) >= 4) {
	ret->ctxt = xmlCreatePushParserCtxt(ret->sax, NULL,
			     (const char *) xmlBufContent(ret->input->buffer),
                                            4, URI);
	ret->base = 0;
	ret->cur = 4;
    } else {
	ret->ctxt = xmlCreatePushParserCtxt(ret->sax, NULL, NULL, 0, URI);
	ret->base = 0;
	ret->cur = 0;
    }

    if (ret->ctxt == NULL) {
	xmlBufFree(ret->buffer);
	xmlFree(ret->sax);
	xmlFree(ret);
	return(NULL);
    }
    ret->ctxt->parseMode = XML_PARSE_READER;
    ret->ctxt->_private = ret;
    ret->ctxt->linenumbers = 1;
    ret->ctxt->dictNames = 1;
    ret->allocs = XML_TEXTREADER_CTXT;
    /*
     * use the parser dictionary to allocate all elements and attributes names
     */
    ret->dict = ret->ctxt->dict;
#ifdef LIBXML_XINCLUDE_ENABLED
    ret->xinclude = 0;
#endif
#ifdef LIBXML_PATTERN_ENABLED
    ret->patternMax = 0;
    ret->patternTab = NULL;
#endif
    return(ret);
}